

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u32 sqlite3IsTrueOrFalse(char *zIn)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    bVar1 = zIn[lVar3];
    bVar2 = "true"[lVar3];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) goto LAB_00186d60;
    }
    else if (""[bVar1] != ""[bVar2]) {
LAB_00186d60:
      if (bVar1 == bVar2) {
        return 0x10000000;
      }
      lVar3 = 0;
      do {
        bVar1 = zIn[lVar3];
        if (bVar1 == "false"[lVar3]) {
          if ((ulong)bVar1 == 0) {
            return 0x20000000;
          }
        }
        else if (""[bVar1] != ""[(byte)"false"[lVar3]]) {
          return 0;
        }
        lVar3 = lVar3 + 1;
      } while( true );
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE u32 sqlite3IsTrueOrFalse(const char *zIn){
  if( sqlite3StrICmp(zIn, "true")==0  ) return EP_IsTrue;
  if( sqlite3StrICmp(zIn, "false")==0 ) return EP_IsFalse;
  return 0;
}